

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  ImVec4 *pIVar5;
  ImVec4 *__dest;
  int iVar6;
  int iVar7;
  undefined7 in_register_00000031;
  uint uVar8;
  float fVar9;
  undefined8 in_XMM0_Qb;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar13._8_8_ = in_XMM0_Qb;
  auVar13._0_8_ = cr_min;
  fVar10 = cr_max.x;
  fVar9 = cr_max.y;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) {
    fVar11 = (this->_CmdHeader).ClipRect.z;
    fVar1 = (this->_CmdHeader).ClipRect.w;
    uVar2 = (this->_CmdHeader).ClipRect.x;
    uVar3 = (this->_CmdHeader).ClipRect.y;
    auVar12._4_4_ = uVar3;
    auVar12._0_4_ = uVar2;
    auVar12._8_8_ = 0;
    auVar13 = maxps(auVar12,auVar13);
    cr_min = auVar13._0_8_;
    if (fVar10 <= fVar11) {
      fVar11 = fVar10;
    }
    fVar10 = fVar11;
    if (fVar1 < fVar9) {
      fVar9 = fVar1;
    }
  }
  iVar7 = (this->_ClipRectStack).Size;
  iVar4 = (this->_ClipRectStack).Capacity;
  if (iVar7 == iVar4) {
    iVar7 = iVar7 + 1;
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar4 / 2 + iVar4;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar4 < iVar7) {
      __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar7 << 4);
      pIVar5 = (this->_ClipRectStack).Data;
      if (pIVar5 != (ImVec4 *)0x0) {
        memcpy(__dest,pIVar5,(long)(this->_ClipRectStack).Size << 4);
        ImGui::MemFree((this->_ClipRectStack).Data);
      }
      (this->_ClipRectStack).Data = __dest;
      (this->_ClipRectStack).Capacity = iVar7;
    }
  }
  uVar8 = -(uint)(fVar9 <= cr_min.y);
  fVar11 = (float)(~uVar8 & (uint)fVar9 | (uint)cr_min.y & uVar8);
  uVar8 = -(uint)(fVar10 <= cr_min.x);
  fVar9 = (float)(~uVar8 & (uint)fVar10 | uVar8 & (uint)cr_min.x);
  pIVar5 = (this->_ClipRectStack).Data;
  iVar7 = (this->_ClipRectStack).Size;
  pIVar5[iVar7].x = cr_min.x;
  pIVar5[iVar7].y = cr_min.y;
  pIVar5[iVar7].z = fVar9;
  pIVar5[iVar7].w = fVar11;
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  (this->_CmdHeader).ClipRect.x = cr_min.x;
  (this->_CmdHeader).ClipRect.y = cr_min.y;
  (this->_CmdHeader).ClipRect.z = fVar9;
  (this->_CmdHeader).ClipRect.w = fVar11;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}